

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 get_src2(DisasContext_conflict8 *dc,uint insn)

{
  int iVar1;
  TCGTemp *a1;
  TCGContext_conflict8 *s;
  TCGArg a2;
  TCGv_i32 pTVar2;
  
  if ((insn >> 0xd & 1) == 0) {
    s = dc->uc->tcg_ctx;
    if ((insn & 0x1f) != 0) {
      return (TCGv_i32)s->cpu_regs[insn & 0x1f];
    }
    if (4 < (uint)dc->n_ttl) {
LAB_00a4442c:
      __assert_fail("dc->n_ttl < ARRAY_SIZE(dc->ttl)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/sparc/translate.c"
                    ,0x7c,"TCGv_i64 get_temp_tl(DisasContext *)");
    }
    a1 = tcg_temp_new_internal_sparc64(s,TCG_TYPE_I64,false);
    pTVar2 = (TCGv_i32)((long)a1 - (long)s);
    iVar1 = dc->n_ttl;
    dc->n_ttl = iVar1 + 1;
    dc->ttl[iVar1] = pTVar2;
    a2 = 0;
  }
  else {
    if (4 < (uint)dc->n_ttl) goto LAB_00a4442c;
    a2 = (long)((ulong)insn << 0x33) >> 0x33;
    s = dc->uc->tcg_ctx;
    a1 = tcg_temp_new_internal_sparc64(s,TCG_TYPE_I64,false);
    pTVar2 = (TCGv_i32)((long)a1 - (long)s);
    iVar1 = dc->n_ttl;
    dc->n_ttl = iVar1 + 1;
    dc->ttl[iVar1] = pTVar2;
  }
  tcg_gen_op2_sparc64(s,INDEX_op_movi_i64,(TCGArg)a1,a2);
  return pTVar2;
}

Assistant:

static TCGv get_src2(DisasContext *dc, unsigned int insn)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    if (IS_IMM) { /* immediate */
        target_long simm = GET_FIELDs(insn, 19, 31);
        TCGv t = get_temp_tl(dc);
        tcg_gen_movi_tl(tcg_ctx, t, simm);
        return t;
    } else {      /* register */
        unsigned int rs2 = GET_FIELD(insn, 27, 31);
        return gen_load_gpr(dc, rs2);
    }
}